

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

void invoke_prog_explosives(OBJ_DATA *obj,CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *in_RDX;
  CHAR_DATA *in_RSI;
  long in_RDI;
  int fuse;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  uint in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  if (0 < *(short *)(in_RDI + 0x118)) {
    send_to_char((char *)in_RSI,in_RDX);
    return;
  }
  bVar1 = is_number((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (bVar1) {
    iVar2 = atoi((char *)in_RDX);
    if ((0 < iVar2) && (iVar2 < 0x31)) {
      act((char *)in_RSI,in_RDX,(void *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
          (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
      act((char *)in_RSI,in_RDX,(void *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
          (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
      *(short *)(in_RDI + 0x118) = (short)iVar2;
      return;
    }
    if (iVar2 == 0) {
      act((char *)in_RSI,in_RDX,(void *)(ulong)in_stack_ffffffffffffffe0,
          (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
      act((char *)in_RSI,in_RDX,(void *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
          (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
      unequip_char((CHAR_DATA *)obj,(OBJ_DATA *)ch,argument._7_1_);
      bag_explode(in_RSI,(OBJ_DATA *)in_RDX,iVar2);
      return;
    }
    act((char *)in_RSI,in_RDX,(void *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
        (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
    act((char *)in_RSI,in_RDX,(void *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
        (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
  }
  else {
    act((char *)in_RSI,in_RDX,(void *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
        (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
    act((char *)in_RSI,in_RDX,(void *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
        (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
  }
  iVar2 = number_range(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  *(short *)(in_RDI + 0x118) = (short)iVar2;
  return;
}

Assistant:

void invoke_prog_explosives(OBJ_DATA *obj, CHAR_DATA *ch, char *argument)
{
	int fuse;

	if (obj->timer > 0)
	{
		send_to_char("The fuse is already set.\n\r", ch);
		return;
	}

	if (is_number(argument))
	{
		fuse = atoi(argument);

		if (fuse < 1 || fuse > 48)
		{
			if (fuse == 0)
			{
				act("$n sets $p and stuffs it in $s mouth!", ch, obj, 0, TO_ROOM);
				act("You set $p and stuff it in your mouth!", ch, obj, 0, TO_CHAR);

				unequip_char(ch, obj, true);
				bag_explode(ch, obj, 3);
				return;
			}

			act("$n fumbles awkwardly with $p, and it begins to tick.", ch, obj, 0, TO_ROOM);
			act("You fumble awkwardly with $p, and it begins to tick.", ch, obj, 0, TO_CHAR);
		}
		else
		{
			act("$n sets the fuse of $p, and it begins to tick.", ch, obj, 0, TO_ROOM);
			act("You set the fuse of $p, and it begins to tick.", ch, obj, 0, TO_CHAR);

			obj->timer = fuse;
			return;
		}
	}
	else
	{
		act("$n fumbles awkwardly with $p, and it begins to tick.", ch, obj, 0, TO_ROOM);
		act("You fumble awkwardly with $p, and it begins to tick.", ch, obj, 0, TO_CHAR);
	}

	fuse = number_range(2, 48);
	obj->timer = fuse;
}